

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this,int overrun,int d)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  int iVar7;
  char *in_RAX;
  uint uVar8;
  char *p;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  byte unaff_R12B;
  size_t __n;
  pair<const_char_*,_int> pVar12;
  void *data;
  char *local_38;
  
  pcVar4 = this->next_chunk_;
  if (pcVar4 == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = this->buffer_;
  if (pcVar4 != pcVar1) {
    this->buffer_end_ = pcVar4 + (long)this->size_ + -0x10;
    this->next_chunk_ = pcVar1;
    if (this->aliasing_ != 1) {
      return pcVar4;
    }
    this->aliasing_ = 2;
    return pcVar4;
  }
  uVar6 = *(undefined8 *)(this->buffer_end_ + 8);
  *(undefined8 *)pcVar1 = *(undefined8 *)this->buffer_end_;
  *(undefined8 *)(this->buffer_ + 8) = uVar6;
  if (0 < this->overall_limit_) {
    local_38 = in_RAX;
    if (-1 < d) {
      pcVar4 = this->buffer_ + 0x10;
      pcVar9 = pcVar1 + overrun;
      do {
        if (pcVar4 <= pcVar9) goto LAB_00280208;
        bVar2 = *pcVar9;
        p = pcVar9 + 1;
        uVar8 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar11 = ((uint)bVar2 + (uint)(byte)*p * 0x80) - 0x80;
          if (*p < '\0') {
            lVar10 = -0x15;
            pcVar9 = pcVar9 + 3;
            do {
              p = pcVar9;
              uVar11 = ((byte)p[-1] - 1 << ((char)lVar10 + 0x23U & 0x1f)) + uVar11;
              uVar8 = uVar11;
              if (-1 < p[-1]) break;
              pcVar9 = p + 1;
              p = (char *)0x0;
              lVar10 = lVar10 + 7;
              uVar8 = 0;
            } while (lVar10 != 0);
          }
          else {
            p = pcVar9 + 2;
            uVar8 = uVar11;
          }
        }
        if (pcVar4 < p || p == (char *)0x0) {
switchD_002800fa_default:
          bVar5 = false;
          unaff_R12B = 0;
        }
        else {
          iVar7 = d;
          if (uVar8 == 0) {
LAB_0028012a:
            bVar5 = false;
            unaff_R12B = 1;
            d = iVar7;
          }
          else {
            switch(uVar8 & 7) {
            case 0:
              p = VarintParse<unsigned_long>(p,(unsigned_long *)&local_38);
              unaff_R12B = unaff_R12B & p != (char *)0x0;
              if (p == (char *)0x0) {
                bVar5 = false;
                goto LAB_002801d8;
              }
              break;
            case 1:
              p = p + 8;
              break;
            case 2:
              bVar2 = *p;
              uVar8 = (uint)bVar2;
              if ((char)bVar2 < '\0') {
                pVar12 = ReadSizeFallback(p,(uint)bVar2);
                uVar8 = pVar12.second;
                p = pVar12.first;
              }
              else {
                p = p + 1;
              }
              if ((p == (char *)0x0) || ((long)pcVar4 - (long)p < (long)(int)uVar8)) {
                bVar5 = false;
                unaff_R12B = 0;
              }
              else {
                p = p + (int)uVar8;
                bVar5 = true;
              }
              if (!bVar5) {
                bVar5 = false;
                goto LAB_002801d8;
              }
              break;
            case 3:
              d = d + 1;
              break;
            case 4:
              iVar7 = d + -1;
              bVar5 = d < 1;
              d = iVar7;
              if (bVar5) goto LAB_0028012a;
              break;
            case 5:
              p = p + 4;
              break;
            default:
              goto switchD_002800fa_default;
            }
            bVar5 = true;
          }
        }
LAB_002801d8:
        pcVar9 = p;
      } while (bVar5);
      if ((unaff_R12B & 1) != 0) goto LAB_0028028b;
    }
LAB_00280208:
    do {
      iVar7 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_38,&this->size_);
      if ((char)iVar7 == '\0') {
        this->overall_limit_ = 0;
        goto LAB_00280286;
      }
      iVar3 = this->size_;
      __n = (size_t)iVar3;
      this->overall_limit_ = this->overall_limit_ - iVar3;
      if (0x10 < (long)__n) {
        uVar6 = *(undefined8 *)(local_38 + 8);
        *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_38;
        *(undefined8 *)(this->buffer_ + 0x18) = uVar6;
        this->next_chunk_ = local_38;
        this->buffer_end_ = this->buffer_ + 0x10;
        goto LAB_00280277;
      }
    } while (iVar3 < 1);
    memcpy(this->buffer_ + 0x10,local_38,__n);
    this->next_chunk_ = pcVar1;
    this->buffer_end_ = pcVar1 + __n;
LAB_00280277:
    if (1 < this->aliasing_) {
      this->aliasing_ = 1;
    }
LAB_00280286:
    if ((char)iVar7 != '\0') {
      return pcVar1;
    }
  }
LAB_0028028b:
  if (this->aliasing_ == 2) {
    this->aliasing_ = (long)this->buffer_end_ - (long)pcVar1;
  }
  this->next_chunk_ = (char *)0x0;
  this->buffer_end_ = this->buffer_ + 0x10;
  this->size_ = 0;
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::Next(int overrun, int d) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (d < 0 || !ParseEndsInSlopRegion(buffer_, overrun, d))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}